

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UChar * ures_getStringByKey_63(UResourceBundle *resB,char *inKey,int32_t *len,UErrorCode *status)

{
  uint table;
  UChar *pUVar1;
  ResourceData *pResData;
  UResourceBundle *resB_00;
  UErrorCode UVar2;
  uint local_4c;
  char *key;
  int32_t t;
  UResourceDataEntry *local_38;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      table = resB->fRes;
      if ((table & 0xf0000000) == 0x20000000 || (table & 0xe0000000) == 0x40000000) {
        t = 0;
        pResData = &resB->fResData;
        key = inKey;
        local_4c = res_getTableItemByKey_63(pResData,table,&t,&key);
        if ((local_4c != 0xffffffff) ||
           ((UVar2 = U_MISSING_RESOURCE_ERROR, resB->fHasFallback == '\x01' &&
            (key = inKey, pResData = getFallbackData(resB,&key,&local_38,&local_4c,status),
            *status < U_ILLEGAL_ARGUMENT_ERROR)))) {
          if (local_4c >> 0x1c == 6) {
LAB_002ba283:
            pUVar1 = res_getString_63(pResData,local_4c,len);
            return pUVar1;
          }
          if (local_4c >> 0x1c == 3) {
            resB_00 = ures_getByKey_63(resB,inKey,(UResourceBundle *)0x0,status);
            pUVar1 = ures_getString_63(resB_00,len,status);
            ures_close_63(resB_00);
            return pUVar1;
          }
          if (local_4c >> 0x1c == 0) goto LAB_002ba283;
          UVar2 = U_RESOURCE_TYPE_MISMATCH;
        }
        *status = UVar2;
      }
      else {
        *status = U_RESOURCE_TYPE_MISMATCH;
      }
    }
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getStringByKey(const UResourceBundle *resB, const char* inKey, int32_t* len, UErrorCode *status) {
    Resource res = RES_BOGUS;
    UResourceDataEntry *realData = NULL;
    const char* key = inKey;

    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        int32_t t=0;

        res = res_getTableItemByKey(&(resB->fResData), resB->fRes, &t, &key);

        if(res == RES_BOGUS) {
            key = inKey;
            if(resB->fHasFallback == TRUE) {
                const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
                if(U_SUCCESS(*status)) {
                    switch (RES_GET_TYPE(res)) {
                    case URES_STRING:
                    case URES_STRING_V2:
                        return res_getString(rd, res, len);
                    case URES_ALIAS:
                      {
                        const UChar* result = 0;
                        UResourceBundle *tempRes = ures_getByKey(resB, inKey, NULL, status);
                        result = ures_getString(tempRes, len, status);
                        ures_close(tempRes);
                        return result;
                      }
                    default:
                        *status = U_RESOURCE_TYPE_MISMATCH;
                    }
                } else {
                    *status = U_MISSING_RESOURCE_ERROR;
                }
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            switch (RES_GET_TYPE(res)) {
            case URES_STRING:
            case URES_STRING_V2:
                return res_getString(&(resB->fResData), res, len);
            case URES_ALIAS:
              {
                const UChar* result = 0;
                UResourceBundle *tempRes = ures_getByKey(resB, inKey, NULL, status);
                result = ures_getString(tempRes, len, status);
                ures_close(tempRes);
                return result;
              }
            default:
                *status = U_RESOURCE_TYPE_MISMATCH;
            }
        }
    } 
#if 0 
    /* this is a kind of TODO item. If we have an array with an index table, we could do this. */
    /* not currently */   
    else if(RES_GET_TYPE(resB->fRes) == URES_ARRAY && resB->fHasFallback == TRUE) {
        /* here should go a first attempt to locate the key using index table */
        const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
        if(U_SUCCESS(*status)) {
            return res_getString(rd, res, len);
        } else {
            *status = U_MISSING_RESOURCE_ERROR;
        }
    } 
#endif    
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }